

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtsp_connect(connectdata *conn,_Bool *done)

{
  Curl_easy *pCVar1;
  CURLcode CVar2;
  Curl_easy *data;
  CURLcode httpStatus;
  _Bool *done_local;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  CVar2 = Curl_http_connect(conn,done);
  if ((pCVar1->state).rtsp_next_client_CSeq == 0) {
    (pCVar1->state).rtsp_next_client_CSeq = 1;
  }
  if ((pCVar1->state).rtsp_next_server_CSeq == 0) {
    (pCVar1->state).rtsp_next_server_CSeq = 1;
  }
  (conn->proto).rtspc.rtp_channel = -1;
  return CVar2;
}

Assistant:

static CURLcode rtsp_connect(struct connectdata *conn, bool *done)
{
  CURLcode httpStatus;
  struct Curl_easy *data = conn->data;

  httpStatus = Curl_http_connect(conn, done);

  /* Initialize the CSeq if not already done */
  if(data->state.rtsp_next_client_CSeq == 0)
    data->state.rtsp_next_client_CSeq = 1;
  if(data->state.rtsp_next_server_CSeq == 0)
    data->state.rtsp_next_server_CSeq = 1;

  conn->proto.rtspc.rtp_channel = -1;

  return httpStatus;
}